

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_sysprof.c
# Opt level: O0

void lj_sysprof_add_trace(GCtrace *tr)

{
  GCtrace *in_RDI;
  lj_wbuf *unaff_retaddr;
  sysprof *sp;
  uint8_t in_stack_ffffffffffffffef;
  sysprof *psVar1;
  
  psVar1 = &sysprof;
  if ((sysprof.state == 1) && (sysprof.opt.mode != '\0')) {
    sysprof.state = 0;
    lj_wbuf_addbyte((lj_wbuf *)&sysprof,in_stack_ffffffffffffffef);
    lj_symtab_dump_trace(unaff_retaddr,in_RDI);
    psVar1->state = 1;
  }
  return;
}

Assistant:

void lj_sysprof_add_trace(const struct GCtrace *tr)
{
  struct sysprof *sp = &sysprof;

  if (sp->state != SPS_PROFILE || sp->opt.mode == LUAM_SYSPROF_DEFAULT)
    return;

  /* See the comment about the sysprof state above. */
  sp->state = SPS_IDLE;
  lj_wbuf_addbyte(&sp->out, LJP_SYMTAB_TRACE_EVENT);
  lj_symtab_dump_trace(&sp->out, tr);
  sp->state = SPS_PROFILE;
}